

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase325::run(TestCase325 *this)

{
  long lVar1;
  Builder builder;
  long lVar2;
  void *pvVar3;
  Request<capnp::DynamicStruct,_capnp::DynamicStruct> *value;
  size_t sVar4;
  void *__buf;
  void *__buf_00;
  int iVar5;
  Maybe<capnp::MessageSize> *pMVar6;
  PromiseBase this_00;
  StringPtr methodName;
  StringPtr methodName_00;
  StringPtr methodName_01;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  bool barFailed;
  int callCount;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_test_c__:345:7),_capnp::Response<capnp::DynamicStruct>_>
  promise3;
  Client local_3c8;
  ArrayPtr<const_char> local_3a8;
  char *local_398;
  DebugComparison<const_char_(&)[4],_capnp::Text::Reader> _kjCondition_1;
  WaitScope waitScope;
  Response<capnp::DynamicStruct> response1;
  Response<capnp::DynamicStruct> response2;
  Request<capnp::DynamicStruct,_capnp::DynamicStruct> request2;
  Request<capnp::DynamicStruct,_capnp::DynamicStruct> request1;
  Request<capnp::DynamicStruct,_capnp::DynamicStruct> request3;
  BuilderFor<DynamicStruct> local_190;
  RemotePromise<capnp::DynamicStruct> promise2;
  RemotePromise<capnp::DynamicStruct> promise1;
  Maybe<capnp::MessageSize> local_f0;
  Maybe<capnp::MessageSize> local_d8;
  Maybe<capnp::MessageSize> local_c0;
  EventLoop loop;
  void *__buf_01;
  
  kj::EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  kj::EventLoop::enterScope(&loop);
  callCount = 0;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&request2,&callCount);
  capnproto_test::capnp::test::TestInterface::Client::Client<capnp::_::TestInterfaceImpl,void>
            ((Client *)&request1,(Own<capnp::_::TestInterfaceImpl,_std::nullptr_t> *)&request2);
  lVar1 = *(long *)((long)request1.super_Builder.schema.super_Schema.raw + -0x18);
  local_3c8.super_Client.hook.disposer =
       *(Disposer **)((long)&request1.super_Builder.schema.super_Schema.raw + lVar1);
  local_3c8.super_Client.hook.ptr =
       *(ClientHook **)((long)&request1.super_Builder.builder.segment + lVar1);
  *(undefined8 *)((long)&request1.super_Builder.builder.segment + lVar1) = 0;
  local_3c8.schema.super_Schema.raw = (Schema)((long)schemas::s_88eb12a0e0af92b2 + 0x48);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&request1.super_Builder.builder);
  kj::Own<capnp::_::TestInterfaceImpl,_std::nullptr_t>::dispose
            ((Own<capnp::_::TestInterfaceImpl,_std::nullptr_t> *)&request2);
  pMVar6 = &local_c0;
  local_c0.ptr.isSet = false;
  methodName.content.size_ = 4;
  methodName.content.ptr = "foo";
  DynamicCapability::Client::newRequest(&request1,&local_3c8,methodName,pMVar6);
  iVar5 = (int)pMVar6;
  request2.super_Builder.schema.super_Schema.raw._0_4_ = 3;
  request2.super_Builder.builder.segment = (SegmentBuilder *)0x7b;
  name_01.content.size_ = 2;
  name_01.content.ptr = "i";
  DynamicStruct::Builder::set(&request1.super_Builder,name_01,(Reader *)&request2);
  DynamicValue::Reader::~Reader((Reader *)&request2);
  value = &request2;
  request2.super_Builder.schema.super_Schema.raw._0_4_ = 2;
  request2.super_Builder.builder.segment =
       (SegmentBuilder *)CONCAT71(request2.super_Builder.builder.segment._1_7_,1);
  name_02.content.size_ = 2;
  name_02.content.ptr = "j";
  DynamicStruct::Builder::set(&request1.super_Builder,name_02,(Reader *)value);
  DynamicValue::Reader::~Reader((Reader *)&request2);
  Request<capnp::DynamicStruct,_capnp::DynamicStruct>::send
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)&promise1,(int)&request1,__buf,
             (size_t)value,iVar5);
  pMVar6 = &local_d8;
  local_d8.ptr.isSet = false;
  methodName_00.content.size_ = 4;
  methodName_00.content.ptr = "baz";
  DynamicCapability::Client::newRequest(&request2,&local_3c8,methodName_00,pMVar6);
  iVar5 = (int)pMVar6;
  sVar4 = 2;
  DynamicStruct::Builder::init(&request3.super_Builder,(EVP_PKEY_CTX *)&request2);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_190,(Builder *)&request3);
  builder.builder.segment = local_190.builder.segment;
  builder.schema.super_Schema.raw = local_190.schema.super_Schema.raw;
  builder.builder.capTable = local_190.builder.capTable;
  builder.builder.data = local_190.builder.data;
  builder.builder.pointers = local_190.builder.pointers;
  builder.builder.dataSize = local_190.builder.dataSize;
  builder.builder.pointerCount = local_190.builder.pointerCount;
  builder.builder._38_2_ = local_190.builder._38_2_;
  initDynamicTestMessage(builder);
  DynamicValue::Builder::~Builder((Builder *)&request3);
  Request<capnp::DynamicStruct,_capnp::DynamicStruct>::send
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)&promise2,(int)&request2,
             __buf_00,sVar4,iVar5);
  barFailed = false;
  pMVar6 = &local_f0;
  local_f0.ptr.isSet = false;
  sVar4 = 4;
  methodName_01.content.size_ = 4;
  methodName_01.content.ptr = "bar";
  DynamicCapability::Client::newRequest(&request3,&local_3c8,methodName_01,pMVar6);
  Request<capnp::DynamicStruct,_capnp::DynamicStruct>::send
            ((Request<capnp::DynamicStruct,_capnp::DynamicStruct> *)&response1,(int)&request3,
             __buf_01,sVar4,(int)pMVar6);
  lVar2 = CONCAT44(response1.super_Reader.schema.super_Schema.raw._4_4_,
                   response1.super_Reader.schema.super_Schema.raw._0_4_);
  lVar1 = *(long *)(lVar2 + 8);
  if (lVar1 == 0 || (ulong)(lVar2 - lVar1) < 0x30) {
    pvVar3 = operator_new(0x400);
    this_00.node.ptr = (OwnPromiseNode)((long)pvVar3 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00.node.ptr,(OwnPromiseNode *)&response1,
               kj::_::
               TransformPromiseNode<capnp::Response<capnp::DynamicStruct>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:345:7),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:347:10)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3d0) = &PTR_destroy_0064aea8;
    *(bool **)((long)pvVar3 + 0x3f8) = &barFailed;
    *(void **)((long)pvVar3 + 0x3d8) = pvVar3;
  }
  else {
    *(undefined8 *)(lVar2 + 8) = 0;
    this_00.node.ptr = (OwnPromiseNode)(lVar2 + -0x30);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00.node.ptr,(OwnPromiseNode *)&response1,
               kj::_::
               TransformPromiseNode<capnp::Response<capnp::DynamicStruct>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:345:7),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:347:10)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)(lVar2 + -0x30) = &PTR_destroy_0064aea8;
    *(bool **)(lVar2 + -8) = &barFailed;
    *(long *)(lVar2 + -0x28) = lVar1;
  }
  response2.super_Reader.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x0;
  _kjCondition_1.left = (char (*) [4])0x0;
  promise3.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this_00.node.ptr;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition_1);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&response2);
  RemotePromise<capnp::DynamicStruct>::~RemotePromise
            ((RemotePromise<capnp::DynamicStruct> *)&response1);
  response1.super_Reader.schema.super_Schema.raw._0_4_ = 0;
  response1.super_Reader.reader.pointers._0_1_ = callCount == 0;
  response1.super_Reader.reader.capTable = (CapTableReader *)anon_var_dwarf_3d166;
  response1.super_Reader.reader.data = &DAT_00000005;
  response1.super_Reader.reader.segment = (SegmentReader *)&callCount;
  if ((!(bool)response1.super_Reader.reader.pointers._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    response2.super_Reader.schema.super_Schema.raw =
         (Schema)((ulong)response2.super_Reader.schema.super_Schema.raw & 0xffffffff00000000);
    kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x160,ERROR,
               "\"failed: expected \" \"(0) == (callCount)\", _kjCondition, 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",
               (DebugComparison<int,_int_&> *)&response1,(int *)&response2,&callCount);
  }
  kj::Promise<capnp::Response<capnp::DynamicStruct>_>::wait
            ((Promise<capnp::Response<capnp::DynamicStruct>_> *)&response1,&promise1);
  local_398 = "foo";
  name.content.size_ = 2;
  name.content.ptr = "x";
  DynamicStruct::Reader::get((Reader *)&response2,&response1.super_Reader,name);
  local_3a8 = (ArrayPtr<const_char>)
              DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&response2)
  ;
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            (&_kjCondition_1,(DebugExpression<char_const(&)[4]> *)&local_398,(Reader *)&local_3a8);
  DynamicValue::Reader::~Reader((Reader *)&response2);
  if ((_kjCondition_1.result == false) && (kj::_::Debug::minSeverity < 3)) {
    name_00.content.size_ = 2;
    name_00.content.ptr = "x";
    DynamicStruct::Reader::get((Reader *)&response2,&response1.super_Reader,name_00);
    local_3a8 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                          ((Reader *)&response2);
    kj::_::Debug::
    log<char_const(&)[60],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x164,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (response1.get(\\\"x\\\").as<Text>())\", _kjCondition, \"foo\", response1.get(\"x\").as<Text>()"
               ,(char (*) [60])"failed: expected (\"foo\") == (response1.get(\"x\").as<Text>())",
               &_kjCondition_1,(char (*) [4])"foo",(Reader *)&local_3a8);
    DynamicValue::Reader::~Reader((Reader *)&response2);
  }
  kj::Promise<capnp::Response<capnp::DynamicStruct>_>::wait
            ((Promise<capnp::Response<capnp::DynamicStruct>_> *)&response2,&promise2);
  kj::Promise<void>::wait(&promise3,&waitScope);
  _kjCondition_1.op.content.size_._0_1_ = callCount == 2;
  _kjCondition_1.left = (char (*) [4])CONCAT44(_kjCondition_1.left._4_4_,2);
  _kjCondition_1.right.super_StringPtr.content.size_ = (size_t)anon_var_dwarf_3d166;
  _kjCondition_1.op.content.ptr = &DAT_00000005;
  _kjCondition_1.right.super_StringPtr.content.ptr = (char *)&callCount;
  if (kj::_::Debug::minSeverity < 3 && !(bool)(undefined1)_kjCondition_1.op.content.size_) {
    local_3a8.ptr._0_4_ = 2;
    kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x16a,ERROR,
               "\"failed: expected \" \"(2) == (callCount)\", _kjCondition, 2, callCount",
               (char (*) [36])"failed: expected (2) == (callCount)",
               (DebugComparison<int,_int_&> *)&_kjCondition_1,(int *)&local_3a8,&callCount);
  }
  _kjCondition_1.left = (char (*) [4])&barFailed;
  if ((barFailed == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[27],kj::_::DebugExpression<bool&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x16b,ERROR,"\"failed: expected \" \"barFailed\", _kjCondition",
               (char (*) [27])"failed: expected barFailed",
               (DebugExpression<bool_&> *)&_kjCondition_1);
  }
  kj::Own<capnp::ResponseHook,_std::nullptr_t>::dispose(&response2.hook);
  kj::Own<capnp::ResponseHook,_std::nullptr_t>::dispose(&response1.hook);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise3);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose(&request3.hook);
  RemotePromise<capnp::DynamicStruct>::~RemotePromise(&promise2);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose(&request2.hook);
  RemotePromise<capnp::DynamicStruct>::~RemotePromise(&promise1);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose(&request1.hook);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&local_3c8);
  kj::WaitScope::~WaitScope(&waitScope);
  kj::EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Capability, DynamicClient) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int callCount = 0;
  DynamicCapability::Client client =
      test::TestInterface::Client(kj::heap<TestInterfaceImpl>(callCount));

  auto request1 = client.newRequest("foo");
  request1.set("i", 123);
  request1.set("j", true);
  auto promise1 = request1.send();

  auto request2 = client.newRequest("baz");
  initDynamicTestMessage(request2.init("s").as<DynamicStruct>());
  auto promise2 = request2.send();

  bool barFailed = false;
  auto request3 = client.newRequest("bar");
  auto promise3 = request3.send().then(
      [](Response<DynamicStruct>&& response) {
        ADD_FAILURE() << "Expected bar() call to fail.";
      }, [&](kj::Exception&& e) {
        EXPECT_EQ(kj::Exception::Type::UNIMPLEMENTED, e.getType());
        barFailed = true;
      });

  EXPECT_EQ(0, callCount);

  auto response1 = promise1.wait(waitScope);

  EXPECT_EQ("foo", response1.get("x").as<Text>());

  auto response2 = promise2.wait(waitScope);

  promise3.wait(waitScope);

  EXPECT_EQ(2, callCount);
  EXPECT_TRUE(barFailed);
}